

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void Abc_NtkDumpOneCex(FILE *pFile,Abc_Ntk_t *pNtk,Abc_Cex_t *pCex,int fPrintFull,int fNames,
                      int fUseFfNames,int fMinimize,int fUseOldMin,int fCheckCex,int fUseSatBased,
                      int fHighEffort,int fAiger,int fVerbose)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  Abc_Cex_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Vec_Ptr_t *pVVar13;
  int local_5c;
  Abc_Cex_t *pCexFull;
  ulong local_50;
  ulong local_48;
  void *local_40;
  long local_38;
  
  if (fPrintFull == 0) {
    if (fNames == 0) {
      for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
        pAVar4 = Abc_NtkBox(pNtk,iVar10);
        if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
          iVar1 = Abc_LatchIsInit0(pAVar4);
          fputc(0x31 - iVar1,(FILE *)pFile);
        }
      }
      for (uVar8 = pCex->nRegs; (int)uVar8 < pCex->nBits; uVar8 = uVar8 + 1) {
        if ((fAiger != 0) && ((int)(uVar8 - pCex->nRegs) % pCex->nPis == 0)) {
          fputc(10,(FILE *)pFile);
        }
        fputc((((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) + 0x30,
              (FILE *)pFile);
      }
      return;
    }
    pCexFull = (Abc_Cex_t *)0x0;
    if (fMinimize == 0) {
      fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
      pAVar4 = Abc_NtkCo(pNtk,pCex->iPo);
      pcVar5 = Abc_ObjName(pAVar4);
      pAVar3 = (Abc_Cex_t *)0x0;
      fprintf((FILE *)pFile," %s",pcVar5);
    }
    else {
      pAVar2 = Abc_NtkToDar(pNtk,0,1);
      fwrite("# FALSIFYING OUTPUTS:",0x15,1,(FILE *)pFile);
      pAVar4 = Abc_NtkCo(pNtk,pCex->iPo);
      pcVar5 = Abc_ObjName(pAVar4);
      fprintf((FILE *)pFile," %s",pcVar5);
      if (fUseOldMin == 0) {
        if (fUseSatBased == 0) {
          pAVar3 = Bmc_CexCareMinimize(pAVar2,pAVar2->nTruePis,pCex,4,fCheckCex,fVerbose);
          pCexFull = pAVar3;
        }
        else {
          pAVar3 = Bmc_CexCareSatBasedMinimize
                             (pAVar2,pAVar2->nTruePis,pCex,fHighEffort,fCheckCex,fVerbose);
          pCexFull = pAVar3;
        }
      }
      else {
        pAVar3 = Saig_ManCbaFindCexCareBits(pAVar2,pCex,0,fVerbose);
        pCexFull = pAVar3;
        if (fCheckCex != 0) {
          Bmc_CexCareVerify(pAVar2,pCex,pAVar3,fVerbose);
        }
      }
      Aig_ManStop(pAVar2);
      if (pAVar3 == (Abc_Cex_t *)0x0) {
        puts("Counter-example minimization has failed.");
        pAVar3 = (Abc_Cex_t *)0x0;
      }
    }
    fputc(10,(FILE *)pFile);
    fprintf((FILE *)pFile,"# COUNTEREXAMPLE LENGTH: %u\n",(ulong)(pCex->iFrame + 1));
    if ((fUseFfNames == 0) || (iVar10 = Abc_NtkCheckSpecialPi(pNtk), iVar10 == 0)) {
      for (iVar10 = 0; iVar10 < pNtk->vBoxes->nSize; iVar10 = iVar10 + 1) {
        pAVar4 = Abc_NtkBox(pNtk,iVar10);
        if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
          pcVar5 = Abc_ObjName((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray])
          ;
          iVar1 = Abc_LatchIsInit0(pAVar4);
          fprintf((FILE *)pFile,"%s@0=%c\n",pcVar5,(ulong)(0x31 - iVar1));
        }
      }
      for (uVar8 = 0; (int)uVar8 <= pCex->iFrame; uVar8 = uVar8 + 1) {
        for (iVar10 = 0; iVar10 < pNtk->vPis->nSize; iVar10 = iVar10 + 1) {
          pAVar4 = Abc_NtkPi(pNtk,iVar10);
          if ((pAVar3 == (Abc_Cex_t *)0x0) ||
             (uVar7 = pAVar3->nPis * uVar8 + pAVar3->nRegs + iVar10,
             ((uint)(&pAVar3[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0)) {
            pcVar5 = Abc_ObjName(pAVar4);
            uVar7 = pCex->nPis * uVar8 + pCex->nRegs + iVar10;
            fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar5,(ulong)uVar8,
                    (ulong)((((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) +
                           0x30));
          }
        }
      }
    }
    else {
      lVar11 = 0;
      while( true ) {
        pVVar13 = pNtk->vPis;
        iVar10 = pVVar13->nSize;
        iVar1 = (int)lVar11;
        if (iVar10 <= iVar1) break;
        pAVar4 = Abc_NtkPi(pNtk,iVar1);
        pcVar5 = Abc_ObjName(pAVar4);
        iVar10 = strcmp(pcVar5,"_abc_190121_abc_");
        if (iVar10 == 0) {
          pVVar13 = pNtk->vPis;
          iVar10 = pVVar13->nSize;
          break;
        }
        lVar11 = lVar11 + 1;
      }
      if (iVar10 == iVar1) {
        fwrite("IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n",0x45,1,
               _stdout);
        return;
      }
      uVar12 = lVar11 + 1;
      local_5c = 0;
      uVar9 = uVar12 & 0xffffffff;
      local_38 = lVar11;
      while (iVar1 = (int)uVar9, iVar1 < iVar10) {
        pAVar4 = Abc_NtkPi(pNtk,iVar1);
        pcVar5 = Abc_ObjName(pAVar4);
        local_5c = local_5c + (uint)(*pcVar5 == 'x');
        pVVar13 = pNtk->vPis;
        iVar10 = pVVar13->nSize;
        uVar9 = (ulong)(iVar1 + 1);
      }
      local_40 = malloc((long)iVar10 << 2);
      memset(local_40,0xff,(long)iVar10 << 2);
      local_50 = (ulong)(uint)-local_5c;
      local_48 = 0;
      uVar9 = uVar12;
      while( true ) {
        iVar10 = pVVar13->nSize;
        if (iVar10 <= (int)uVar9) break;
        pAVar4 = Abc_NtkPi(pNtk,(int)uVar9);
        pcVar5 = Abc_ObjName(pAVar4);
        if (*pcVar5 == 'x') {
          iVar10 = (int)local_48;
          local_48 = (ulong)(iVar10 + 1);
          *(int *)((long)local_40 + uVar9 * 4) = (int)local_50 + iVar10 + (int)local_38;
        }
        uVar9 = uVar9 + 1;
        pVVar13 = pNtk->vPis;
      }
      if ((int)local_48 != local_5c) {
        __assert_fail("iFlop == nXValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                      ,0x9d2,
                      "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                     );
      }
      for (; iVar1 = (int)uVar12, iVar1 < iVar10; uVar12 = uVar12 + 1) {
        iVar10 = *(int *)((long)local_40 + uVar12 * 4);
        if (iVar10 == -1) {
          pAVar4 = Abc_NtkPi(pNtk,iVar1);
          pcVar6 = Abc_ObjName(pAVar4);
          pAVar4 = Abc_NtkPi(pNtk,iVar1);
          pcVar5 = Abc_ObjName(pAVar4);
          uVar8 = (uint)*pcVar5;
LAB_002d7908:
          fprintf((FILE *)pFile,"%s@0=%c\n",pcVar6 + 1,(ulong)uVar8);
        }
        else {
          uVar8 = pAVar3->nRegs + iVar10;
          if (((uint)(&pAVar3[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) {
            pAVar4 = Abc_NtkPi(pNtk,iVar1);
            pcVar6 = Abc_ObjName(pAVar4);
            uVar8 = iVar10 + pCex->nRegs;
            uVar8 = (((uint)(&pCex[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0) + 0x30;
            goto LAB_002d7908;
          }
        }
        iVar10 = pNtk->vPis->nSize;
      }
      free(local_40);
      local_50 = local_50 + local_38;
      for (uVar8 = 0; (int)uVar8 <= pCex->iFrame; uVar8 = uVar8 + 1) {
        for (iVar10 = 0; iVar10 < pNtk->vPis->nSize; iVar10 = iVar10 + 1) {
          pAVar4 = Abc_NtkPi(pNtk,iVar10);
          if ((int)local_50 == iVar10) break;
          if ((pAVar3 == (Abc_Cex_t *)0x0) ||
             (uVar7 = pAVar3->nPis * uVar8 + pAVar3->nRegs + iVar10,
             ((uint)(&pAVar3[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0)) {
            pcVar5 = Abc_ObjName(pAVar4);
            uVar7 = pCex->nPis * uVar8 + pCex->nRegs + iVar10;
            fprintf((FILE *)pFile,"%s@%d=%c\n",pcVar5,(ulong)uVar8,
                    (ulong)((((uint)(&pCex[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) +
                           0x30));
          }
        }
      }
    }
  }
  else {
    pAVar2 = Abc_NtkToDar(pNtk,0,1);
    pAVar3 = Saig_ManExtendCex(pAVar2,pCex);
    pCexFull = pAVar3;
    Aig_ManStop(pAVar2);
    pVVar13 = pNtk->vCis;
    iVar10 = pCex->iFrame;
    if (pAVar3->nBits != (iVar10 + 1) * pVVar13->nSize) {
      __assert_fail("pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/io.c"
                    ,0x999,
                    "void Abc_NtkDumpOneCex(FILE *, Abc_Ntk_t *, Abc_Cex_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    for (uVar8 = 0; (int)uVar8 <= iVar10; uVar8 = uVar8 + 1) {
      for (iVar10 = 0; iVar10 < pVVar13->nSize; iVar10 = iVar10 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(pVVar13,iVar10);
        pcVar5 = Abc_ObjName(pAVar4);
        uVar7 = pNtk->vCis->nSize * uVar8 + iVar10;
        fprintf((FILE *)pFile,"%s@%d=%c ",pcVar5,(ulong)uVar8,
                (ulong)((((uint)(&pAVar3[1].iPo)[(int)uVar7 >> 5] >> (uVar7 & 0x1f) & 1) != 0) +
                       0x30));
        pVVar13 = pNtk->vCis;
      }
      iVar10 = pCex->iFrame;
    }
  }
  Abc_CexFreeP(&pCexFull);
  return;
}

Assistant:

void Abc_NtkDumpOneCex( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex, 
    int fPrintFull, int fNames, int fUseFfNames, int fMinimize, int fUseOldMin, 
    int fCheckCex, int fUseSatBased, int fHighEffort, int fAiger, int fVerbose )
{
    Abc_Obj_t * pObj;
    int i, f;
    if ( fPrintFull )
    {
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Abc_Cex_t * pCexFull = Saig_ManExtendCex( pAig, pCex );
        Aig_ManStop( pAig );
        // output PI values (while skipping the minimized ones)
        assert( pCexFull->nBits == Abc_NtkCiNum(pNtk) * (pCex->iFrame + 1) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            Abc_NtkForEachCi( pNtk, pObj, i )
                fprintf( pFile, "%s@%d=%c ", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCexFull->pData, Abc_NtkCiNum(pNtk)*f + i) );
        Abc_CexFreeP( &pCexFull );
    }
    else if ( fNames )
    {
        Abc_Cex_t * pCare = NULL;
        if ( fMinimize )
        {
            extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                                       
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) ); 
            if ( fUseOldMin )
            {
                pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, 0, fVerbose );
                if ( fCheckCex )
                    Bmc_CexCareVerify( pAig, pCex, pCare, fVerbose );
            }
            else if ( fUseSatBased )
                pCare = Bmc_CexCareSatBasedMinimize( pAig, Saig_ManPiNum(pAig), pCex, fHighEffort, fCheckCex, fVerbose );
            else
                pCare = Bmc_CexCareMinimize( pAig, Saig_ManPiNum(pAig), pCex, 4, fCheckCex, fVerbose );
            Aig_ManStop( pAig );
            if(pCare == NULL)                                           
                printf( "Counter-example minimization has failed.\n" ); 
        }
        else
        {
            fprintf( pFile, "# FALSIFYING OUTPUTS:");                        
            fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, pCex->iPo)) );
        }
        fprintf( pFile, "\n");                                           
        fprintf( pFile, "# COUNTEREXAMPLE LENGTH: %u\n", pCex->iFrame+1);
        if ( fUseFfNames && Abc_NtkCheckSpecialPi(pNtk) )
        {
            int * pValues;
            int nXValues = 0, iFlop = 0, iPivotPi = -1;
            Abc_NtkForEachPi( pNtk, pObj, iPivotPi )
                if ( !strcmp(Abc_ObjName(pObj), "_abc_190121_abc_") )
                    break;
            if ( iPivotPi == Abc_NtkPiNum(pNtk) )
            {
                fprintf( stdout, "IoCommandWriteCex(): Cannot find special PI required by switch \"-z\".\n" );
                return;
            }
            // count X-valued flops
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    nXValues++;
            // map X-valued flops into auxiliary PIs
            pValues = ABC_FALLOC( int, Abc_NtkPiNum(pNtk) );
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( Abc_ObjName(Abc_NtkPi(pNtk, i))[0] == 'x' )
                    pValues[i] = iPivotPi - nXValues + iFlop++;
            assert( iFlop == nXValues );
            // write flop values
            for ( i = iPivotPi+1; i < Abc_NtkPiNum(pNtk); i++ )
                if ( pValues[i] == -1 )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, Abc_ObjName(Abc_NtkPi(pNtk, i))[0] );
                else if ( Abc_InfoHasBit(pCare->pData, pCare->nRegs + pValues[i]) )
                    fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_NtkPi(pNtk, i))+1, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs + pValues[i]) );
            ABC_FREE( pValues );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                {
                    if ( i == iPivotPi - nXValues ) break;
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
                }
        }
        else
        {
            // output flop values (unaffected by the minimization)
            Abc_NtkForEachLatch( pNtk, pObj, i )
                fprintf( pFile, "%s@0=%c\n", Abc_ObjName(Abc_ObjFanout0(pObj)), '0'+!Abc_LatchIsInit0(pObj) );
            // output PI values (while skipping the minimized ones)
            for ( f = 0; f <= pCex->iFrame; f++ )
                Abc_NtkForEachPi( pNtk, pObj, i )
                    if ( !pCare || Abc_InfoHasBit(pCare->pData, pCare->nRegs+pCare->nPis*f + i) )
                        fprintf( pFile, "%s@%d=%c\n", Abc_ObjName(pObj), f, '0'+Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i) );
        }
        Abc_CexFreeP( &pCare );
    }
    else
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            fprintf( pFile, "%c", '0'+!Abc_LatchIsInit0(pObj) );

        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        {
            if ( fAiger && (i-pCex->nRegs)%pCex->nPis == 0)
                fprintf( pFile, "\n");
            fprintf( pFile, "%c", '0'+Abc_InfoHasBit(pCex->pData, i) );
        }
    }
}